

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

timer_object_holder<timertt::thread_safety::unsafe> __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::allocate(timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [24];
  timer_type *this_00;
  timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  undefined1 auVar2 [64];
  
  this_00 = (timer_type *)operator_new(0x48);
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar1 = auVar2._0_16_;
  (this_00->super_timer_object<timertt::thread_safety::unsafe>)._vptr_timer_object =
       (_func_int **)auVar1._0_8_;
  (this_00->super_timer_object<timertt::thread_safety::unsafe>).m_references = auVar1._8_4_;
  *(int *)&(this_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = auVar1._12_4_;
  this_00->m_when = (time_point)auVar2._16_8_;
  this_00->m_period = (duration)auVar2._24_8_;
  auVar3 = SUB3224(auVar2._32_32_,0);
  (this_00->m_action).super__Function_base._M_functor = (_Any_data)auVar3._0_16_;
  (this_00->m_action).super__Function_base._M_manager = (_Manager_type)auVar3._16_8_;
  (this_00->m_action)._M_invoker = (_Invoker_type)SUB328(auVar2._32_32_,0x18);
  this_00->m_position = 0;
  timer_type::timer_type(this_00);
  timer_object_holder<timertt::thread_safety::unsafe>::timer_object_holder
            ((timer_object_holder<timertt::thread_safety::unsafe> *)this,
             (timer_object<timertt::thread_safety::unsafe> *)this_00);
  return (timer_object_holder<timertt::thread_safety::unsafe>)
         (timer_object<timertt::thread_safety::unsafe> *)this;
}

Assistant:

timer_object_holder< THREAD_SAFETY >
	allocate()
	{
		return timer_object_holder< THREAD_SAFETY >( new timer_type() );
	}